

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfIDManifest.cpp
# Opt level: O0

void Imf_3_3::anon_unknown_3::readPascalString(char **readPtr,char *endPtr,string *outputString)

{
  undefined8 uVar1;
  ulong uVar2;
  string *in_RDX;
  ulong in_RSI;
  long *in_RDI;
  uint length;
  uint *in_stack_ffffffffffffff88;
  char *pcVar3;
  InputExc *in_stack_ffffffffffffff90;
  allocator local_49;
  string local_48 [32];
  uint local_28;
  string *local_18;
  ulong local_10;
  long *local_8;
  
  if (in_RSI < *in_RDI + 4U) {
    uVar1 = __cxa_allocate_exception(0x48);
    Iex_3_3::InputExc::InputExc(in_stack_ffffffffffffff90,(char *)in_stack_ffffffffffffff88);
    __cxa_throw(uVar1,&Iex_3_3::InputExc::typeinfo,Iex_3_3::InputExc::~InputExc);
  }
  local_28 = 0;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  Xdr::read<Imf_3_3::CharPtrIO,char_const*>
            ((char **)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  if (local_10 < *local_8 + (ulong)local_28) {
    uVar1 = __cxa_allocate_exception(0x48);
    Iex_3_3::InputExc::InputExc(in_stack_ffffffffffffff90,(char *)in_stack_ffffffffffffff88);
    __cxa_throw(uVar1,&Iex_3_3::InputExc::typeinfo,Iex_3_3::InputExc::~InputExc);
  }
  pcVar3 = (char *)*local_8;
  uVar2 = (ulong)local_28;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_48,pcVar3,uVar2,&local_49);
  std::__cxx11::string::operator=(local_18,local_48);
  std::__cxx11::string::~string(local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  *local_8 = *local_8 + (ulong)local_28;
  return;
}

Assistant:

void
readPascalString (
    const char*& readPtr, const char* endPtr, string& outputString)
{

    if (readPtr + 4 > endPtr)
    {
        throw IEX_NAMESPACE::InputExc ("IDManifest too small for string size");
    }
    unsigned int length = 0;
    Xdr::read<CharPtrIO> (readPtr, length);

    if (readPtr + length > endPtr)
    {
        throw IEX_NAMESPACE::InputExc ("IDManifest too small for string");
    }
    outputString = string ((const char*) readPtr, length);
    readPtr += length;
}